

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset_function.cc
# Opt level: O3

VectorXd __thiscall
projects::ipdg_stokes::assemble::createOffsetFunction
          (assemble *this,shared_ptr<const_lf::mesh::Mesh> *mesh,MeshDataSet<bool> *boundary,
          DofHandler *dofh,
          function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *dirichlet_data,
          SparseMatrix<double,_0,_int> *A)

{
  undefined8 *puVar1;
  pointer pcVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  Scalar SVar5;
  element_type *peVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  undefined8 uVar10;
  assemble *this_00;
  int iVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  size_type sVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar17;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  Scalar *pSVar18;
  Entity *pEVar19;
  CoeffReturnType pdVar20;
  undefined4 extraout_var_21;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long lVar21;
  Index extraout_RDX_03;
  int ed_sub_idx;
  ulong uVar22;
  string *this_01;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  double __tmp_3;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  span<const_long,_18446744073709551615UL> sVar32;
  VectorXd VVar33;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  SparseMatrix<double,_0,_int> Js;
  gdof_idx_t dof_idx;
  Entity *node_p;
  VectorXd rhs;
  VectorXd offset_function_local;
  ActualDstType actualDst;
  COOMatrix<double> J;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  undefined1 local_668 [64];
  MeshDataSet<bool> *local_628;
  undefined1 local_620 [32];
  StorageIndex *local_600;
  CompressedStorage<double,_int> local_5f8;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [72];
  Matrix<double,__1,_1,_0,__1,_1> *pMStack_580;
  StorageIndex *local_578;
  XprTypeNested pMStack_570;
  StorageIndex *local_568;
  size_type sStack_560;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_558;
  undefined1 local_548 [40];
  iterator local_520;
  Entity **local_518;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_510;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_498;
  vector<long,std::allocator<long>> local_480 [8];
  iterator local_478;
  long *local_470;
  pointer local_468;
  iterator local_460;
  long *local_458;
  pointer local_450;
  iterator local_448;
  long *local_440;
  Entity *local_438;
  block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true> local_430;
  _Any_data *local_420;
  assemble *local_418;
  DofHandler *local_410;
  COOMatrix<double> local_408;
  undefined1 local_3e8 [40];
  iterator local_3c0;
  Entity **local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_398;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  vector<long,std::allocator<long>> local_320 [8];
  iterator local_318;
  long *local_310;
  pointer local_308;
  iterator local_300;
  long *local_2f8;
  pointer local_2f0;
  iterator local_2e8;
  long *local_2e0;
  Scalar *local_2d8;
  double local_2d0;
  SparseMatrix<double,_0,_int> *local_2c8;
  _func_int **local_2c0;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *local_2b8;
  PiecewiseBoundaryNormalJumpAssembler local_2b0;
  undefined1 local_298 [16];
  _Alloc_hider local_288;
  variable_if_dynamic<long,__1> vStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Any_data *local_268;
  _Any_data local_48;
  undefined4 extraout_var_03;
  
  peVar6 = (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_3e8._16_8_ =
       (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8._16_8_)->_M_use_count + 1;
    }
  }
  local_2c0 = (_func_int **)&PTR__DynamicFEDofHandler_004a1920;
  local_3e8._0_8_ = &PTR__DynamicFEDofHandler_004a1920;
  local_3e8._24_4_ = 0;
  local_628 = boundary;
  local_5c8._40_8_ = mesh;
  local_410 = dofh;
  local_3e8._8_8_ = peVar6;
  memset(local_3e8 + 0x20,0,0xf0);
  iVar11 = (**peVar6->_vptr_Mesh)(peVar6);
  if (iVar11 == 2) {
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_5d8._8_8_;
    local_5d8 = auVar31 << 0x40;
    uVar12 = (*(*(_func_int ***)local_3e8._8_8_)[3])(local_3e8._8_8_,2);
    uVar22 = (ulong)uVar12;
    local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_380,uVar22,(value_type_conflict3 *)local_298);
    local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
    local_418 = this;
    local_2c8 = A;
    local_2b8 = dirichlet_data;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_338,(ulong)(uVar12 + 1),(value_type_conflict3 *)local_298);
    if (uVar12 != 0) {
      uVar26 = 0;
      do {
        iVar11 = (*(*(_func_int ***)local_3e8._8_8_)[6])(local_3e8._8_8_,2,uVar26 & 0xffffffff);
        local_5c8._64_8_ = CONCAT44(extraout_var,iVar11);
        uVar12 = (*(*(_func_int ***)local_3e8._8_8_)[5])(local_3e8._8_8_,local_5c8._64_8_);
        uVar10 = local_5c8._64_8_;
        if (uVar26 != uVar12) goto LAB_002fe413;
        local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar26] = local_5d8._0_4_;
        iVar11 = (*(*(_func_int ***)local_5c8._64_8_)[4])(local_5c8._64_8_);
        if (((char)iVar11 == '\x01') &&
           (iVar11 = (**local_628->_vptr_MeshDataSet)(local_628,uVar10),
           *(char *)CONCAT44(extraout_var_00,iVar11) != '\0')) {
          local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = 1;
          if (local_2e8._M_current == local_2e0) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_2f0,local_2e8,(long *)local_5d8);
          }
          else {
            *local_2e8._M_current = local_5d8._0_8_;
            local_2e8._M_current = local_2e8._M_current + 1;
          }
          if (local_3c0._M_current == local_3b8) {
            std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
            _M_realloc_insert<lf::mesh::Entity_const*const&>
                      ((vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                       (local_3e8 + 0x20),local_3c0,(Entity **)(local_5c8 + 0x40));
          }
          else {
            *local_3c0._M_current = (Entity *)local_5c8._64_8_;
            local_3c0._M_current = local_3c0._M_current + 1;
          }
          local_5d8._0_8_ =
               (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               (local_5d8._0_8_ + 1);
        }
        else {
          local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = 0;
        }
        uVar26 = uVar26 + 1;
      } while (uVar22 != uVar26);
    }
    local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar22] = local_5d8._0_4_;
    uVar12 = (*(*(_func_int ***)local_3e8._8_8_)[3])(local_3e8._8_8_,1);
    uVar22 = (ulong)uVar12;
    local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_398,uVar22,(value_type_conflict3 *)local_298);
    local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_350,(ulong)(uVar12 + 1),(value_type_conflict3 *)local_298);
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      uVar26 = 0;
      uVar12 = 0;
      do {
        iVar11 = (*(*(_func_int ***)local_3e8._8_8_)[6])(local_3e8._8_8_,1,uVar26 & 0xffffffff);
        local_5c8._64_8_ = CONCAT44(extraout_var_01,iVar11);
        uVar13 = (*(*(_func_int ***)local_3e8._8_8_)[5])(local_3e8._8_8_,local_5c8._64_8_);
        uVar10 = local_5c8._64_8_;
        if (uVar26 != uVar13) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_298);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_288,"Edge index mismatch",0x13);
          pp_Var4 = (_func_int **)(local_548 + 0x10);
          local_548._0_8_ = pp_Var4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,"mesh_p_->Index(*edge) == edge_idx","");
          pcVar2 = local_620 + 0x10;
          local_620._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_620,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed
                    ((string *)local_548,(string *)local_620,0x263,(string *)local_668);
          if ((undefined1 *)local_668._0_8_ != local_668 + 0x10) {
            operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1);
          }
          if ((pointer)local_620._0_8_ != pcVar2) {
            operator_delete((void *)local_620._0_8_,
                            CONCAT26(local_620._22_2_,CONCAT24(local_620._20_2_,local_620._16_4_)) +
                            1);
          }
          if ((_func_int **)local_548._0_8_ != pp_Var4) {
            operator_delete((void *)local_548._0_8_,(ulong)(local_548._16_8_ + 1));
          }
          local_548._16_6_ = 0x65736c6166;
          local_548._8_8_ = (element_type *)0x5;
          local_620._0_8_ = pcVar2;
          local_548._0_8_ = pp_Var4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_620,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                     ,"");
          local_668._8_8_ = (non_const_type)0x0;
          local_668[0x10] = '\0';
          local_668._0_8_ = local_668 + 0x10;
          lf::base::AssertionFailed
                    ((string *)local_548,(string *)local_620,0x263,(string *)local_668);
          goto LAB_002fe6ce;
        }
        local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar26] = uVar12;
        iVar11 = (*(*(_func_int ***)local_5c8._64_8_)[4])(local_5c8._64_8_);
        if (((char)iVar11 == '\x01') &&
           (iVar11 = (**local_628->_vptr_MeshDataSet)(local_628,uVar10),
           *(char *)CONCAT44(extraout_var_02,iVar11) != '\0')) {
          uVar13 = 1;
          bVar9 = true;
        }
        else {
          bVar9 = false;
          uVar13 = 0;
        }
        local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar26] = uVar13;
        iVar11 = (*(*(_func_int ***)local_5c8._64_8_)[1])(local_5c8._64_8_,1);
        puVar17 = (undefined8 *)CONCAT44(extraout_var_03,iVar11);
        if (extraout_RDX != 0) {
          puVar1 = puVar17 + extraout_RDX;
          do {
            uVar13 = (*(*(_func_int ***)local_3e8._8_8_)[5])(local_3e8._8_8_,*puVar17);
            uVar23 = (ulong)local_380.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13];
            if (uVar23 != 0) {
              uVar24 = local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar13];
              uVar12 = uVar12 + local_380.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar13];
              do {
                if (local_300._M_current == local_2f8) {
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            ((vector<long,std::allocator<long>> *)&local_308,local_300,
                             local_2f0 + uVar24);
                }
                else {
                  *local_300._M_current = local_2f0[uVar24];
                  local_300._M_current = local_300._M_current + 1;
                }
                uVar24 = uVar24 + 1;
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
            }
            puVar17 = puVar17 + 1;
          } while (puVar17 != puVar1);
        }
        if (bVar9) {
          if (local_300._M_current == local_2f8) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_308,local_300,(long *)local_5d8);
          }
          else {
            *local_300._M_current = local_5d8._0_8_;
            local_300._M_current = local_300._M_current + 1;
          }
          if (local_3c0._M_current == local_3b8) {
            std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
            _M_realloc_insert<lf::mesh::Entity_const*const&>
                      ((vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                       (local_3e8 + 0x20),local_3c0,(Entity **)(local_5c8 + 0x40));
          }
          else {
            *local_3c0._M_current = (Entity *)local_5c8._64_8_;
            local_3c0._M_current = local_3c0._M_current + 1;
          }
          uVar12 = uVar12 + 1;
          local_5d8._0_8_ =
               (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               (local_5d8._0_8_ + 1);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar22);
    }
    local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar22] = uVar12;
    uVar12 = (*(*(_func_int ***)local_3e8._8_8_)[3])(local_3e8._8_8_,0);
    local_5c8._48_8_ = ZEXT48(uVar12);
    local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_3b0,local_5c8._48_8_,(value_type_conflict3 *)local_298);
    local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_368,(ulong)(uVar12 + 1),(value_type_conflict3 *)local_298);
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else {
      uVar22 = 0;
      uVar12 = 0;
      do {
        iVar11 = (*(*(_func_int ***)local_3e8._8_8_)[6])(local_3e8._8_8_,0,uVar22 & 0xffffffff);
        pEVar19 = (Entity *)CONCAT44(extraout_var_04,iVar11);
        local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar22] = uVar12;
        local_298._0_8_ = pEVar19;
        iVar11 = (*pEVar19->_vptr_Entity[4])(pEVar19);
        if (((char)iVar11 == '\x01') &&
           (iVar11 = (**local_628->_vptr_MeshDataSet)(local_628,pEVar19),
           *(char *)CONCAT44(extraout_var_05,iVar11) != '\0')) {
          uVar13 = 1;
          bVar9 = true;
        }
        else {
          bVar9 = false;
          uVar13 = 0;
        }
        local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar22] = uVar13;
        iVar11 = (*(*(_func_int ***)local_298._0_8_)[1])(local_298._0_8_,2);
        puVar17 = (undefined8 *)CONCAT44(extraout_var_06,iVar11);
        if (extraout_RDX_00 != 0) {
          puVar1 = puVar17 + extraout_RDX_00;
          do {
            uVar13 = (*(*(_func_int ***)local_3e8._8_8_)[5])(local_3e8._8_8_,*puVar17);
            uVar26 = (ulong)local_380.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13];
            if (uVar26 != 0) {
              uVar24 = local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar13];
              uVar12 = uVar12 + local_380.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar13];
              do {
                if (local_318._M_current == local_310) {
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            (local_320,local_318,local_2f0 + uVar24);
                }
                else {
                  *local_318._M_current = local_2f0[uVar24];
                  local_318._M_current = local_318._M_current + 1;
                }
                uVar24 = uVar24 + 1;
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
            }
            puVar17 = puVar17 + 1;
          } while (puVar17 != puVar1);
        }
        local_5c8._56_8_ = uVar22;
        iVar11 = (*(*(_func_int ***)local_298._0_8_)[2])();
        iVar14 = (*(*(_func_int ***)local_298._0_8_)[1])(local_298._0_8_,1);
        uVar22 = 0;
        while( true ) {
          iVar15 = (*(*(_func_int ***)local_298._0_8_)[4])();
          local_548[0] = (char)iVar15;
          sVar16 = lf::base::RefEl::NumSubEntities((RefEl *)local_548,1);
          uVar10 = local_5c8._56_8_;
          if (sVar16 <= uVar22) break;
          uVar24 = (*(*(_func_int ***)local_3e8._8_8_)[5])
                             (local_3e8._8_8_,
                              *(undefined8 *)(CONCAT44(extraout_var_08,iVar14) + uVar22 * 8));
          uVar13 = local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar24];
          uVar26 = (ulong)uVar13;
          uVar24 = local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar24 + 1];
          iVar15 = *(int *)(CONCAT44(extraout_var_07,iVar11) + uVar22 * 4);
          if (iVar15 == 1) {
            if (uVar26 != 0) {
              uVar12 = uVar12 + uVar13;
              uVar24 = uVar24 - uVar13;
              do {
                if (local_318._M_current == local_310) {
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            (local_320,local_318,local_308 + uVar24);
                }
                else {
                  *local_318._M_current = local_308[uVar24];
                  local_318._M_current = local_318._M_current + 1;
                }
                uVar24 = uVar24 + 1;
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
            }
          }
          else if ((iVar15 == -1) && (-1 < (int)(uVar13 - 1))) {
            uVar12 = uVar12 + uVar13;
            lVar21 = (ulong)(uVar13 - 1) + 1;
            do {
              uVar24 = uVar24 - 1;
              if (local_318._M_current == local_310) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          (local_320,local_318,local_308 + uVar24);
              }
              else {
                *local_318._M_current = local_308[uVar24];
                local_318._M_current = local_318._M_current + 1;
              }
              lVar25 = lVar21 + -1;
              bVar7 = 0 < lVar21;
              lVar21 = lVar25;
            } while (lVar25 != 0 && bVar7);
          }
          uVar22 = uVar22 + 1;
        }
        if (bVar9) {
          if (local_318._M_current == local_310) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      (local_320,local_318,(long *)local_5d8);
          }
          else {
            *local_318._M_current = local_5d8._0_8_;
            local_318._M_current = local_318._M_current + 1;
          }
          if (local_3c0._M_current == local_3b8) {
            std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
            _M_realloc_insert<lf::mesh::Entity_const*const&>
                      ((vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                       (local_3e8 + 0x20),local_3c0,(Entity **)local_298);
          }
          else {
            *local_3c0._M_current = (Entity *)local_298._0_8_;
            local_3c0._M_current = local_3c0._M_current + 1;
          }
          uVar12 = uVar12 + 1;
          local_5d8._0_8_ =
               (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               (local_5d8._0_8_ + 1);
        }
        uVar22 = uVar10 + 1;
      } while (uVar22 != local_5c8._48_8_);
    }
    local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[local_5c8._48_8_] = uVar12;
    local_3e8._24_4_ = local_5d8._0_4_;
    peVar6 = *(element_type **)local_5c8._40_8_;
    local_548._16_8_ = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._40_8_ + 8))->_M_pi
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._16_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._16_8_)->_M_use_count + 1;
      }
    }
    local_548._0_8_ = local_2c0;
    local_548._24_4_ = 0;
    local_548._8_8_ = peVar6;
    memset(local_548 + 0x20,0,0xf0);
    iVar11 = (**peVar6->_vptr_Mesh)(peVar6);
    if (iVar11 == 2) {
      local_5c8._64_8_ =
           (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)0x0;
      uVar12 = (*(*(_func_int ***)local_548._8_8_)[3])(local_548._8_8_,2);
      uVar22 = (ulong)uVar12;
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_4e0,uVar22,(value_type_conflict3 *)local_298);
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_498,(ulong)(uVar12 + 1),(value_type_conflict3 *)local_298);
      if (uVar12 != 0) {
        uVar26 = 0;
        do {
          iVar11 = (*(*(_func_int ***)local_548._8_8_)[6])(local_548._8_8_,2,uVar26 & 0xffffffff);
          local_438 = (Entity *)CONCAT44(extraout_var_09,iVar11);
          uVar12 = (*(*(_func_int ***)local_548._8_8_)[5])(local_548._8_8_,local_438);
          pEVar19 = local_438;
          if (uVar26 != uVar12) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_298);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_288,"Node index mismatch",0x13);
            pcVar2 = local_620 + 0x10;
            local_620._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_620,"mesh_p_->Index(*node_p) == node_idx","");
            pcVar3 = local_668 + 0x10;
            local_668._0_8_ = pcVar3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_668,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                       ,"");
            std::__cxx11::stringbuf::str();
            lf::base::AssertionFailed
                      ((string *)local_620,(string *)local_668,0x247,(string *)local_5d8);
            if ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                local_5d8._0_8_ !=
                (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                local_5c8) {
              operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
            }
            if ((pointer)local_668._0_8_ != pcVar3) {
              operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1
                             );
            }
            if ((pointer)local_620._0_8_ != pcVar2) {
              operator_delete((void *)local_620._0_8_,
                              CONCAT26(local_620._22_2_,CONCAT24(local_620._20_2_,local_620._16_4_))
                              + 1);
            }
            local_620._16_4_ = 0x736c6166;
            local_620._20_2_ = 0x65;
            local_620._8_8_ = 5;
            local_668._0_8_ = pcVar3;
            local_620._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_668,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                       ,"");
            local_5d8._8_8_ = 0;
            local_5d8._0_8_ =
                 (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_5c8;
            local_5c8._0_8_ = local_5c8._0_8_ & 0xffffffffffffff00;
            lf::base::AssertionFailed
                      ((string *)local_620,(string *)local_668,0x247,(string *)local_5d8);
            goto LAB_002fe98c;
          }
          local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = local_5c8._64_4_;
          iVar11 = (*local_438->_vptr_Entity[4])(local_438);
          if (((char)iVar11 == '\x02') &&
             (iVar11 = (**local_628->_vptr_MeshDataSet)(local_628,pEVar19),
             *(char *)CONCAT44(extraout_var_10,iVar11) != '\0')) {
            local_4e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] = 1;
            if (local_448._M_current == local_440) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_450,local_448,
                         (long *)(local_5c8 + 0x40));
            }
            else {
              *local_448._M_current = local_5c8._64_8_;
              local_448._M_current = local_448._M_current + 1;
            }
            if (local_520._M_current == local_518) {
              std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
              _M_realloc_insert<lf::mesh::Entity_const*const&>
                        ((vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                         (local_548 + 0x20),local_520,&local_438);
            }
            else {
              *local_520._M_current = local_438;
              local_520._M_current = local_520._M_current + 1;
            }
            local_5c8._64_8_ = local_5c8._64_8_ + 1;
          }
          else {
            local_4e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] = 0;
          }
          uVar26 = uVar26 + 1;
        } while (uVar22 != uVar26);
      }
      local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar22] = local_5c8._64_4_;
      uVar12 = (*(*(_func_int ***)local_548._8_8_)[3])(local_548._8_8_,1);
      uVar22 = (ulong)uVar12;
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_4f8,uVar22,(value_type_conflict3 *)local_298);
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_4b0,(ulong)(uVar12 + 1),(value_type_conflict3 *)local_298);
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else {
        uVar26 = 0;
        uVar12 = 0;
        do {
          iVar11 = (*(*(_func_int ***)local_548._8_8_)[6])(local_548._8_8_,1,uVar26 & 0xffffffff);
          local_438 = (Entity *)CONCAT44(extraout_var_11,iVar11);
          uVar13 = (*(*(_func_int ***)local_548._8_8_)[5])(local_548._8_8_,local_438);
          pEVar19 = local_438;
          if (uVar26 != uVar13) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_298);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_288,"Edge index mismatch",0x13);
            pcVar2 = local_620 + 0x10;
            local_620._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_620,"mesh_p_->Index(*edge) == edge_idx","");
            pcVar3 = local_668 + 0x10;
            local_668._0_8_ = pcVar3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_668,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                       ,"");
            std::__cxx11::stringbuf::str();
            lf::base::AssertionFailed
                      ((string *)local_620,(string *)local_668,0x263,(string *)local_5d8);
            if ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                local_5d8._0_8_ !=
                (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                local_5c8) {
              operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
            }
            if ((pointer)local_668._0_8_ != pcVar3) {
              operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1
                             );
            }
            if ((pointer)local_620._0_8_ != pcVar2) {
              operator_delete((void *)local_620._0_8_,
                              CONCAT26(local_620._22_2_,CONCAT24(local_620._20_2_,local_620._16_4_))
                              + 1);
            }
            local_620._16_4_ = 0x736c6166;
            local_620._20_2_ = 0x65;
            local_620._8_8_ = 5;
            local_668._0_8_ = pcVar3;
            local_620._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_668,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                       ,"");
            local_5d8._8_8_ = 0;
            local_5d8._0_8_ =
                 (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_5c8;
            local_5c8._0_8_ = local_5c8._0_8_ & 0xffffffffffffff00;
            lf::base::AssertionFailed
                      ((string *)local_620,(string *)local_668,0x263,(string *)local_5d8);
            goto LAB_002fe98c;
          }
          local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = uVar12;
          iVar11 = (*local_438->_vptr_Entity[4])(local_438);
          if (((char)iVar11 == '\x02') &&
             (iVar11 = (**local_628->_vptr_MeshDataSet)(local_628,pEVar19),
             *(char *)CONCAT44(extraout_var_12,iVar11) != '\0')) {
            uVar13 = 1;
            bVar9 = true;
          }
          else {
            bVar9 = false;
            uVar13 = 0;
          }
          local_4f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = uVar13;
          iVar11 = (*local_438->_vptr_Entity[1])(local_438,1);
          puVar17 = (undefined8 *)CONCAT44(extraout_var_13,iVar11);
          if (extraout_RDX_01 != 0) {
            puVar1 = puVar17 + extraout_RDX_01;
            do {
              uVar13 = (*(*(_func_int ***)local_548._8_8_)[5])(local_548._8_8_,*puVar17);
              uVar23 = (ulong)local_4e0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar13];
              if (uVar23 != 0) {
                uVar24 = local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar13];
                uVar12 = uVar12 + local_4e0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar13];
                do {
                  if (local_460._M_current == local_458) {
                    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                              ((vector<long,std::allocator<long>> *)&local_468,local_460,
                               local_450 + uVar24);
                  }
                  else {
                    *local_460._M_current = local_450[uVar24];
                    local_460._M_current = local_460._M_current + 1;
                  }
                  uVar24 = uVar24 + 1;
                  uVar23 = uVar23 - 1;
                } while (uVar23 != 0);
              }
              puVar17 = puVar17 + 1;
            } while (puVar17 != puVar1);
          }
          if (bVar9) {
            if (local_460._M_current == local_458) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_468,local_460,
                         (long *)(local_5c8 + 0x40));
            }
            else {
              *local_460._M_current = local_5c8._64_8_;
              local_460._M_current = local_460._M_current + 1;
            }
            if (local_520._M_current == local_518) {
              std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
              _M_realloc_insert<lf::mesh::Entity_const*const&>
                        ((vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                         (local_548 + 0x20),local_520,&local_438);
            }
            else {
              *local_520._M_current = local_438;
              local_520._M_current = local_520._M_current + 1;
            }
            uVar12 = uVar12 + 1;
            local_5c8._64_8_ = local_5c8._64_8_ + 1;
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar22);
      }
      local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar22] = uVar12;
      uVar12 = (*(*(_func_int ***)local_548._8_8_)[3])(local_548._8_8_,0);
      local_5c8._48_8_ = ZEXT48(uVar12);
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_510,local_5c8._48_8_,(value_type_conflict3 *)local_298);
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_4c8,(ulong)(uVar12 + 1),(value_type_conflict3 *)local_298);
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else {
        uVar22 = 0;
        uVar12 = 0;
        do {
          iVar11 = (*(*(_func_int ***)local_548._8_8_)[6])(local_548._8_8_,0,uVar22 & 0xffffffff);
          pEVar19 = (Entity *)CONCAT44(extraout_var_14,iVar11);
          local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22] = uVar12;
          local_298._0_8_ = pEVar19;
          iVar11 = (*pEVar19->_vptr_Entity[4])(pEVar19);
          if (((char)iVar11 == '\x02') &&
             (iVar11 = (**local_628->_vptr_MeshDataSet)(local_628,pEVar19),
             *(char *)CONCAT44(extraout_var_15,iVar11) != '\0')) {
            uVar13 = 1;
            bVar9 = true;
          }
          else {
            bVar9 = false;
            uVar13 = 0;
          }
          local_510.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar22] = uVar13;
          iVar11 = (*(*(_func_int ***)local_298._0_8_)[1])(local_298._0_8_,2);
          puVar17 = (undefined8 *)CONCAT44(extraout_var_16,iVar11);
          if (extraout_RDX_02 != 0) {
            puVar1 = puVar17 + extraout_RDX_02;
            do {
              uVar13 = (*(*(_func_int ***)local_548._8_8_)[5])(local_548._8_8_,*puVar17);
              uVar26 = (ulong)local_4e0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar13];
              if (uVar26 != 0) {
                uVar24 = local_498.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar13];
                uVar12 = uVar12 + local_4e0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar13];
                do {
                  if (local_478._M_current == local_470) {
                    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                              (local_480,local_478,local_450 + uVar24);
                  }
                  else {
                    *local_478._M_current = local_450[uVar24];
                    local_478._M_current = local_478._M_current + 1;
                  }
                  uVar24 = uVar24 + 1;
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
              }
              puVar17 = puVar17 + 1;
            } while (puVar17 != puVar1);
          }
          local_5c8._56_8_ = uVar22;
          iVar11 = (*(*(_func_int ***)local_298._0_8_)[2])();
          iVar14 = (*(*(_func_int ***)local_298._0_8_)[1])(local_298._0_8_,1);
          uVar22 = 0;
          while( true ) {
            iVar15 = (*(*(_func_int ***)local_298._0_8_)[4])();
            local_620[0] = (bool)SUB41(iVar15,0);
            sVar16 = lf::base::RefEl::NumSubEntities((RefEl *)local_620,1);
            uVar10 = local_5c8._56_8_;
            if (sVar16 <= uVar22) break;
            uVar24 = (*(*(_func_int ***)local_548._8_8_)[5])
                               (local_548._8_8_,
                                *(undefined8 *)(CONCAT44(extraout_var_18,iVar14) + uVar22 * 8));
            uVar13 = local_4f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar24];
            uVar26 = (ulong)uVar13;
            uVar24 = local_4b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar24 + 1];
            iVar15 = *(int *)(CONCAT44(extraout_var_17,iVar11) + uVar22 * 4);
            if (iVar15 == 1) {
              if (uVar26 != 0) {
                uVar12 = uVar12 + uVar13;
                uVar24 = uVar24 - uVar13;
                do {
                  if (local_478._M_current == local_470) {
                    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                              (local_480,local_478,local_468 + uVar24);
                  }
                  else {
                    *local_478._M_current = local_468[uVar24];
                    local_478._M_current = local_478._M_current + 1;
                  }
                  uVar24 = uVar24 + 1;
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
              }
            }
            else if ((iVar15 == -1) && (-1 < (int)(uVar13 - 1))) {
              uVar12 = uVar12 + uVar13;
              lVar21 = (ulong)(uVar13 - 1) + 1;
              do {
                uVar24 = uVar24 - 1;
                if (local_478._M_current == local_470) {
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            (local_480,local_478,local_468 + uVar24);
                }
                else {
                  *local_478._M_current = local_468[uVar24];
                  local_478._M_current = local_478._M_current + 1;
                }
                lVar25 = lVar21 + -1;
                bVar7 = 0 < lVar21;
                lVar21 = lVar25;
              } while (lVar25 != 0 && bVar7);
            }
            uVar22 = uVar22 + 1;
          }
          if (bVar9) {
            if (local_478._M_current == local_470) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        (local_480,local_478,(long *)(local_5c8 + 0x40));
            }
            else {
              *local_478._M_current = local_5c8._64_8_;
              local_478._M_current = local_478._M_current + 1;
            }
            if (local_520._M_current == local_518) {
              std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
              _M_realloc_insert<lf::mesh::Entity_const*const&>
                        ((vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                         (local_548 + 0x20),local_520,(Entity **)local_298);
            }
            else {
              *local_520._M_current = (Entity *)local_298._0_8_;
              local_520._M_current = local_520._M_current + 1;
            }
            uVar12 = uVar12 + 1;
            local_5c8._64_8_ = local_5c8._64_8_ + 1;
          }
          uVar22 = uVar10 + 1;
        } while (uVar22 != local_5c8._48_8_);
      }
      local_4c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_5c8._48_8_] = uVar12;
      local_548._24_4_ = local_5c8._64_4_;
      local_408.rows_ = local_5c8._64_4_ + 1;
      local_408.cols_ = local_3e8._24_4_ + 1;
      local_408.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_408.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_408.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)local_5c8._40_8_;
      local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._40_8_ + 8))->_M_pi;
      if (local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_2b0.boundary_ = local_628;
      lf::assemble::
      AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_projects::ipdg_stokes::assemble::PiecewiseBoundaryNormalJumpAssembler>
                (0,(DofHandler *)local_3e8,(DofHandler *)local_548,&local_2b0,&local_408);
      if (local_3e8._24_4_ != 0) {
        uVar22 = 0;
        do {
          lf::assemble::COOMatrix<double>::AddToEntry
                    (&local_408,(ulong)(uint)local_548._24_4_,uVar22,1.0);
          uVar22 = uVar22 + 1;
        } while (uVar22 < (uint)local_3e8._24_4_);
      }
      if (local_548._24_4_ != 0) {
        uVar22 = 0;
        do {
          lf::assemble::COOMatrix<double>::AddToEntry
                    (&local_408,uVar22,(ulong)(uint)local_3e8._24_4_,1.0);
          uVar22 = uVar22 + 1;
        } while (uVar22 < (uint)local_548._24_4_);
      }
      lf::assemble::COOMatrix<double>::makeSparse
                ((SparseMatrix<double,_0,_int> *)local_620,&local_408);
      local_668._0_8_ = (pointer)0x0;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_298,(ulong)(local_548._24_4_ + 1),1,
                       (scalar_constant_op<double> *)local_668);
      local_558.m_storage.m_data = (double *)0x0;
      local_558.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_558,local_298._0_8_,1);
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_558,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_298,(assign_op<double,_double> *)local_668);
      auVar8 = _DAT_003cc080;
      auVar31 = _DAT_003cc070;
      if (0 < local_558.m_storage.m_rows) {
        uVar22 = local_558.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
        auVar27._8_4_ = (int)uVar22;
        auVar27._0_8_ = uVar22;
        auVar27._12_4_ = (int)(uVar22 >> 0x20);
        lVar21 = 0;
        auVar27 = auVar27 ^ _DAT_003cc080;
        do {
          auVar29._8_4_ = (int)lVar21;
          auVar29._0_8_ = lVar21;
          auVar29._12_4_ = (int)((ulong)lVar21 >> 0x20);
          auVar29 = (auVar29 | auVar31) ^ auVar8;
          if ((bool)(~(auVar27._4_4_ < auVar29._4_4_ ||
                      auVar27._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar27._4_4_) & 1)) {
            local_558.m_storage.m_data[lVar21] = (double)local_288._M_p;
          }
          if (auVar29._12_4_ <= auVar27._12_4_ &&
              (auVar29._8_4_ <= auVar27._8_4_ || auVar29._12_4_ != auVar27._12_4_)) {
            local_558.m_storage.m_data[lVar21 + 1] = (double)local_288._M_p;
          }
          lVar21 = lVar21 + 2;
        } while ((uVar22 - ((uint)(local_558.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 !=
                 lVar21);
      }
      auVar31 = (**(code **)(**(long **)local_5c8._40_8_ + 0x10))(*(long **)local_5c8._40_8_,0);
      puVar17 = auVar31._0_8_;
      if (auVar31._8_8_ != 0) {
        puVar1 = puVar17 + auVar31._8_8_;
        do {
          pEVar19 = (Entity *)*puVar17;
          ipdg_stokes::mesh::computeOutwardNormals
                    ((Matrix<double,_2,_3,_0,_2,_3> *)local_668,pEVar19);
          iVar11 = (*pEVar19->_vptr_Entity[1])(pEVar19,1);
          lVar21 = 0;
          do {
            pEVar19 = *(Entity **)(CONCAT44(extraout_var_19,iVar11) + lVar21 * 8);
            iVar14 = (**local_628->_vptr_MeshDataSet)(local_628,pEVar19);
            if (*(char *)CONCAT44(extraout_var_20,iVar14) == '\x01') {
              Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>::Block
                        ((Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true> *)
                         (local_5c8 + 0x40),(Matrix<double,_2,_3,_0,_2,_3> *)local_668,lVar21);
              local_5c8._16_8_ = local_568;
              local_5c8._24_8_ = sStack_560;
              local_5c8._0_8_ = local_578;
              local_5c8._8_8_ = pMStack_570;
              local_5d8._8_8_ = pMStack_580;
              local_5d8._0_8_ = local_5c8._64_8_;
              if ((local_2b8->super__Function_base)._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
                goto LAB_002fe413;
              }
              (*local_2b8->_M_invoker)(&local_48,(Entity *)local_2b8);
              local_278._M_allocated_capacity = local_5c8._16_8_;
              local_278._8_8_ = local_5c8._24_8_;
              local_288._M_p = (pointer)local_5c8._0_8_;
              vStack_280.m_value = local_5c8._8_8_;
              local_298._0_8_ = local_5d8._0_8_;
              local_298._8_8_ = local_5d8._8_8_;
              local_2d8 = &local_2d0;
              local_268 = &local_48;
              Eigen::internal::
              block_evaluator<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true,_true>::
              block_evaluator(&local_430,(XprType *)local_298);
              local_420 = local_268;
              local_2d0 = local_430.
                          super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                          .m_data[1] * *(double *)(local_268->_M_pod_data + 8) +
                          *local_430.
                           super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                           .m_data * *(double *)local_268;
              SVar5 = *local_2d8;
              sVar32 = lf::assemble::DynamicFEDofHandler::GlobalDofIndices
                                 ((DynamicFEDofHandler *)local_548,pEVar19);
              pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                        operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                   &local_558,*sVar32._M_ptr);
              *pSVar18 = SVar5;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
          puVar17 = puVar17 + 1;
        } while (puVar17 != puVar1);
      }
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_298);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
      analyzePattern((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                     local_298,(MatrixType *)local_620);
      this_00 = local_418;
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_298,(MatrixType *)local_620);
      local_5d8 = (undefined1  [16])
                  Eigen::
                  SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                  ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                            ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                              *)local_298,
                             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_558);
      Eigen::
      Block<const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1,_1,_false>
      ::Block((Block<const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1,_false>
               *)local_668,
              (Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               *)local_5d8,0,0,(ulong)(uint)local_3e8._24_4_,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>const,_1,1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_438,
                 (DenseBase<Eigen::Block<const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1,_false>_>
                  *)local_668);
      uVar12 = (*local_410->_vptr_DofHandler[2])();
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_5d8._8_8_;
      local_5d8 = auVar8 << 0x40;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_668,(ulong)uVar12,1,(scalar_constant_op<double> *)local_5d8);
      *(undefined8 *)this_00 = 0;
      *(undefined8 *)(this_00 + 8) = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,local_668._0_8_
                 ,1);
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)this_00,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_668,(assign_op<double,_double> *)local_5d8);
      auVar8 = _DAT_003cc080;
      auVar31 = _DAT_003cc070;
      if (0 < *(long *)(this_00 + 8)) {
        lVar21 = *(long *)this_00;
        uVar22 = *(long *)(this_00 + 8) + 0x1fffffffffffffff;
        uVar26 = uVar22 & 0x1fffffffffffffff;
        auVar28._8_4_ = (int)uVar26;
        auVar28._0_8_ = uVar26;
        auVar28._12_4_ = (int)(uVar26 >> 0x20);
        lVar25 = 0;
        auVar28 = auVar28 ^ _DAT_003cc080;
        do {
          auVar30._8_4_ = (int)lVar25;
          auVar30._0_8_ = lVar25;
          auVar30._12_4_ = (int)((ulong)lVar25 >> 0x20);
          auVar27 = (auVar30 | auVar31) ^ auVar8;
          if ((bool)(~(auVar27._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar27._0_4_ ||
                      auVar28._4_4_ < auVar27._4_4_) & 1)) {
            *(ulong *)(lVar21 + lVar25 * 8) = CONCAT71(local_668._17_7_,local_668[0x10]);
          }
          if ((auVar27._12_4_ != auVar28._12_4_ || auVar27._8_4_ <= auVar28._8_4_) &&
              auVar27._12_4_ <= auVar28._12_4_) {
            *(ulong *)(lVar21 + 8 + lVar25 * 8) = CONCAT71(local_668._17_7_,local_668[0x10]);
          }
          lVar25 = lVar25 + 2;
        } while ((uVar26 - ((uint)uVar22 & 1)) + 2 != lVar25);
      }
      if (local_3e8._24_4_ != 0) {
        uVar22 = 0;
        do {
          pEVar19 = lf::assemble::DynamicFEDofHandler::Entity
                              ((DynamicFEDofHandler *)local_3e8,uVar22);
          pdVar20 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                               &local_438,uVar22);
          local_628 = (MeshDataSet<bool> *)*pdVar20;
          iVar11 = (*local_410->_vptr_DofHandler[5])(local_410,pEVar19);
          pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00
                               ,*(Index *)CONCAT44(extraout_var_21,iVar11));
          *pSVar18 = (Scalar)local_628;
          uVar22 = uVar22 + 1;
        } while (uVar22 < (uint)local_3e8._24_4_);
      }
      uVar12 = (**(code **)(**(long **)local_5c8._40_8_ + 0x18))(*(long **)local_5c8._40_8_,2);
      uVar13 = (**(code **)(**(long **)local_5c8._40_8_ + 0x18))(*(long **)local_5c8._40_8_,1);
      Eigen::Block<const_Eigen::SparseMatrix<double,_0,_int>,_-1,_-1,_false>::Block
                ((Block<const_Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false> *)
                 (local_5c8 + 0x40),local_2c8,(ulong)uVar12,0,(ulong)uVar13,local_2c8->m_outerSize);
      Eigen::
      Product<Eigen::Block<const_Eigen::SparseMatrix<double,_0,_int>,_-1,_-1,_false>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
      ::Product((Product<Eigen::Block<const_Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                 *)local_668,(Lhs *)(local_5c8 + 0x40),(Rhs *)this_00);
      uVar12 = (**(code **)(**(long **)local_5c8._40_8_ + 0x18))(*(long **)local_5c8._40_8_,1);
      Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_5d8,
                 (Matrix<double,__1,_1,_0,__1,_1> *)this_00,*(long *)(this_00 + 8) - (ulong)uVar12,0
                 ,(ulong)uVar12,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Product<Eigen::Block<Eigen::SparseMatrix<double,0,int>const,_1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_5d8,
                 (Product<Eigen::Block<const_Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)local_668,(assign_op<double,_double> *)&local_2d8,(type)0x0);
      free(local_438);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_298);
      free(local_558.m_storage.m_data);
      free((void *)local_620._24_8_);
      free(local_600);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_5f8);
      if (local_2b0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2b0.mesh_.
                   super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_408.triplets_.
          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_408.triplets_.
                        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_408.triplets_.
                              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_408.triplets_.
                              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lf::assemble::DynamicFEDofHandler::~DynamicFEDofHandler((DynamicFEDofHandler *)local_548);
      lf::assemble::DynamicFEDofHandler::~DynamicFEDofHandler((DynamicFEDofHandler *)local_3e8);
      VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX_03;
      VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this_00;
      return (VectorXd)
             VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_288,"Can handle 2D meshes only",0x19);
    pcVar2 = local_620 + 0x10;
    local_620._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_620,"(mesh_p_->DimMesh() == 2)","");
    pcVar3 = local_668 + 0x10;
    local_668._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_668,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_620,(string *)local_668,0x239,(string *)local_5d8);
    if ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
        local_5d8._0_8_ !=
        (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_5c8) {
      operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8._0_8_ + 1));
    }
    if ((pointer)local_668._0_8_ != pcVar3) {
      operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1);
    }
    if ((pointer)local_620._0_8_ != pcVar2) {
      operator_delete((void *)local_620._0_8_,
                      CONCAT26(local_620._22_2_,CONCAT24(local_620._20_2_,local_620._16_4_)) + 1);
    }
    local_620._16_4_ = 0x736c6166;
    local_620._20_2_ = 0x65;
    local_620._8_8_ = 5;
    local_668._0_8_ = pcVar3;
    local_620._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_668,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
               ,"");
    local_5d8._8_8_ = 0;
    local_5d8._0_8_ =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_5c8;
    local_5c8._0_8_ = local_5c8._0_8_ & 0xffffffffffffff00;
    lf::base::AssertionFailed((string *)local_620,(string *)local_668,0x239,(string *)local_5d8);
LAB_002fe98c:
    std::__cxx11::string::~string((string *)local_5d8);
    std::__cxx11::string::~string((string *)local_668);
    this_01 = (string *)local_620;
    goto LAB_002fe9a8;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_288,"Can handle 2D meshes only",0x19);
  pp_Var4 = (_func_int **)(local_548 + 0x10);
  local_548._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_548,"(mesh_p_->DimMesh() == 2)","");
  pcVar2 = local_620 + 0x10;
  local_620._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed((string *)local_548,(string *)local_620,0x239,(string *)local_668);
  if ((undefined1 *)local_668._0_8_ != local_668 + 0x10) {
    operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar2) {
    operator_delete((void *)local_620._0_8_,
                    CONCAT26(local_620._22_2_,CONCAT24(local_620._20_2_,local_620._16_4_)) + 1);
  }
  if ((_func_int **)local_548._0_8_ != pp_Var4) {
    operator_delete((void *)local_548._0_8_,(ulong)(local_548._16_8_ + 1));
  }
  local_548._16_6_ = 0x65736c6166;
  local_548._8_8_ = (element_type *)0x5;
  local_620._0_8_ = pcVar2;
  local_548._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,"");
  local_668._8_8_ = (non_const_type)0x0;
  local_668[0x10] = '\0';
  local_668._0_8_ = local_668 + 0x10;
  lf::base::AssertionFailed((string *)local_548,(string *)local_620,0x239,(string *)local_668);
  goto LAB_002fe6ce;
LAB_002fe413:
  std::__cxx11::stringstream::stringstream((stringstream *)local_298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_288,"Node index mismatch",0x13);
  pp_Var4 = (_func_int **)(local_548 + 0x10);
  local_548._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_548,"mesh_p_->Index(*node_p) == node_idx","");
  pcVar2 = local_620 + 0x10;
  local_620._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed((string *)local_548,(string *)local_620,0x247,(string *)local_668);
  if ((undefined1 *)local_668._0_8_ != local_668 + 0x10) {
    operator_delete((void *)local_668._0_8_,CONCAT71(local_668._17_7_,local_668[0x10]) + 1);
  }
  if ((pointer)local_620._0_8_ != pcVar2) {
    operator_delete((void *)local_620._0_8_,
                    CONCAT26(local_620._22_2_,CONCAT24(local_620._20_2_,local_620._16_4_)) + 1);
  }
  if ((_func_int **)local_548._0_8_ != pp_Var4) {
    operator_delete((void *)local_548._0_8_,(ulong)(local_548._16_8_ + 1));
  }
  local_548._16_6_ = 0x65736c6166;
  local_548._8_8_ = (element_type *)0x5;
  local_620._0_8_ = pcVar2;
  local_548._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,"");
  local_668._8_8_ = (non_const_type)0x0;
  local_668[0x10] = '\0';
  local_668._0_8_ = local_668 + 0x10;
  lf::base::AssertionFailed((string *)local_548,(string *)local_620,0x247,(string *)local_668);
LAB_002fe6ce:
  std::__cxx11::string::~string((string *)local_668);
  std::__cxx11::string::~string((string *)local_620);
  this_01 = (string *)local_548;
LAB_002fe9a8:
  std::__cxx11::string::~string(this_01);
  abort();
}

Assistant:

Eigen::VectorXd createOffsetFunction(
    const std::shared_ptr<const lf::mesh::Mesh> &mesh,
    const lf::mesh::utils::MeshDataSet<bool> &boundary,
    const lf::assemble::DofHandler &dofh,
    const std::function<Eigen::Vector2d(const lf::mesh::Entity &)>
        &dirichlet_data,
    const Eigen::SparseMatrix<double> &A) {
  // Create a new dofhandler for the boundary nodes of the mesh
  const lf::assemble::DynamicFEDofHandler boundary_node_dofh(
      mesh, [&](const lf::mesh::Entity &entity) {
        if (entity.RefEl() == lf::base::RefElType::kPoint && boundary(entity)) {
          return 1;
        }
        return 0;
      });
  // Create a new dofhandler for the boundary edges of the mesh
  const lf::assemble::DynamicFEDofHandler boundary_edge_dofh(
      mesh, [&](const lf::mesh::Entity &entity) {
        if (entity.RefEl() == lf::base::RefElType::kSegment &&
            boundary(entity)) {
          return 1;
        }
        return 0;
      });
  // Assemble a matrix mapping the basis function coefficients on the boundary
  // nodes to the normal jumps over the boundary edges
  lf::assemble::COOMatrix<double> J(boundary_edge_dofh.NumDofs() + 1,
                                    boundary_node_dofh.NumDofs() + 1);
  PiecewiseBoundaryNormalJumpAssembler element_matrix_provider(mesh, boundary);
  lf::assemble::AssembleMatrixLocally(0, boundary_node_dofh, boundary_edge_dofh,
                                      element_matrix_provider, J);
  // Add the lagrange multiplier needed such that the average over all
  // coefficients is zero
  for (lf::base::size_type i = 0; i < boundary_node_dofh.NumDofs(); ++i) {
    J.AddToEntry(boundary_edge_dofh.NumDofs(), i, 1);
  }
  for (lf::base::size_type i = 0; i < boundary_edge_dofh.NumDofs(); ++i) {
    J.AddToEntry(i, boundary_node_dofh.NumDofs(), 1);
  }
  const Eigen::SparseMatrix<double> Js = J.makeSparse();
  // Assemble the right hand side from the provided dirichlet data
  Eigen::VectorXd rhs = Eigen::VectorXd::Zero(boundary_edge_dofh.NumDofs() + 1);
  for (const auto *const cell : mesh->Entities(0)) {
    const Eigen::Matrix<double, 2, 3> normals =
        projects::ipdg_stokes::mesh::computeOutwardNormals(*cell);
    const auto edges = cell->SubEntities(1);
    for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
      const auto &edge = *edges[edge_idx];
      if (boundary(edge)) {
        rhs[boundary_edge_dofh.GlobalDofIndices(edge)[0]] =
            normals.col(edge_idx).transpose() * dirichlet_data(edge);
      }
    }
  }
  // Solve for the basis function coefficients of the offset function ordered
  // with the boundary dof handler
  Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
  solver.compute(Js);
  const Eigen::VectorXd offset_function_local =
      solver.solve(rhs).head(boundary_node_dofh.NumDofs());
  // Compute the full offset function including the jump terms
  Eigen::VectorXd offset_function = Eigen::VectorXd::Zero(dofh.NumDofs());
  for (lf::assemble::size_type node_idx = 0;
       node_idx < boundary_node_dofh.NumDofs(); ++node_idx) {
    const auto &node = boundary_node_dofh.Entity(node_idx);
    offset_function[dofh.GlobalDofIndices(node)[0]] =
        offset_function_local[node_idx];
  }
  offset_function.tail(mesh->NumEntities(1)) =
      A.block(mesh->NumEntities(2), 0, mesh->NumEntities(1), A.cols()) *
      offset_function;
  return offset_function;
}